

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine.cpp
# Opt level: O0

QFileSystemEntry *
QFileSystemEngine::getJunctionTarget(QFileSystemEntry *link,QFileSystemMetaData *data)

{
  QFileSystemEntry *in_RDI;
  
  QFileSystemEntry::QFileSystemEntry(in_RDI);
  return in_RDI;
}

Assistant:

QFileSystemEntry QFileSystemEngine::getJunctionTarget(const QFileSystemEntry &link,
                                                      QFileSystemMetaData &data)
{
#if defined(Q_OS_WIN)
    return junctionTarget(link, data);
#else
    Q_UNUSED(link);
    Q_UNUSED(data);
    return {};
#endif
}